

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall ncnn::CpuSet::num_enabled(CpuSet *this)

{
  int iVar1;
  int i;
  ulong uVar2;
  
  iVar1 = 0;
  for (uVar2 = 0; uVar2 != 0x400; uVar2 = uVar2 + 1) {
    iVar1 = iVar1 + (uint)(((this->cpu_set).__bits[uVar2 >> 6] >> (uVar2 & 0x3f) & 1) != 0);
  }
  return iVar1;
}

Assistant:

int CpuSet::num_enabled() const
{
    int num_enabled = 0;
    for (int i = 0; i < (int)sizeof(cpu_set_t) * 8; i++)
    {
        if (is_enabled(i))
            num_enabled++;
    }

    return num_enabled;
}